

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cpp
# Opt level: O2

void ssllabs::Endpoint::parseSimulationClient(ConstObject *obj,labsSimClient_t *labsSimClient)

{
  bool bVar1;
  int iVar2;
  ValueType *pVVar3;
  
  bVar1 = rapidjson::
          GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::HasMember(obj,"id");
  if (bVar1) {
    pVVar3 = rapidjson::
             GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
             ::operator[]<char_const>
                       ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                         *)obj,"id");
    if ((undefined1  [16])((undefined1  [16])pVVar3->data_ & (undefined1  [16])0x20000000000000) !=
        (undefined1  [16])0x0) {
      pVVar3 = rapidjson::
               GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
               ::operator[]<char_const>
                         ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           *)obj,"id");
      iVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetInt(pVVar3);
      labsSimClient->Id = iVar2;
    }
  }
  bVar1 = rapidjson::
          GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::HasMember(obj,"name");
  if (bVar1) {
    pVVar3 = rapidjson::
             GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
             ::operator[]<char_const>
                       ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                         *)obj,"name");
    if ((undefined1  [16])((undefined1  [16])pVVar3->data_ & (undefined1  [16])0x400000000000000) !=
        (undefined1  [16])0x0) {
      pVVar3 = rapidjson::
               GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
               ::operator[]<char_const>
                         ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           *)obj,"name");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GetString(pVVar3);
      std::__cxx11::string::assign((char *)&labsSimClient->Name);
    }
  }
  bVar1 = rapidjson::
          GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::HasMember(obj,"version");
  if (bVar1) {
    pVVar3 = rapidjson::
             GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
             ::operator[]<char_const>
                       ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                         *)obj,"version");
    if ((undefined1  [16])((undefined1  [16])pVVar3->data_ & (undefined1  [16])0x400000000000000) !=
        (undefined1  [16])0x0) {
      pVVar3 = rapidjson::
               GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
               ::operator[]<char_const>
                         ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           *)obj,"version");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GetString(pVVar3);
      std::__cxx11::string::assign((char *)&labsSimClient->Version);
    }
  }
  bVar1 = rapidjson::
          GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::HasMember(obj,"isReference");
  if (bVar1) {
    pVVar3 = rapidjson::
             GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
             ::operator[]<char_const>
                       ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                         *)obj,"isReference");
    if ((undefined1  [16])((undefined1  [16])pVVar3->data_ & (undefined1  [16])0x8000000000000) !=
        (undefined1  [16])0x0) {
      pVVar3 = rapidjson::
               GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
               ::operator[]<char_const>
                         ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           *)obj,"isReference");
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetBool(pVVar3);
      labsSimClient->IsReference = bVar1;
    }
  }
  return;
}

Assistant:

void Endpoint::parseSimulationClient(const rapidjson::GenericValue<rapidjson::UTF8<char>,
            rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::ConstObject &obj,
                                         labsSimClient_t &labsSimClient) {

        if (obj.HasMember("id") && obj["id"].IsInt()) {
            labsSimClient.Id = obj["id"].GetInt();
        }

        if (obj.HasMember("name") && obj["name"].IsString()) {
            labsSimClient.Name.assign(obj["name"].GetString());
        }

        if (obj.HasMember("version") && obj["version"].IsString()) {
            labsSimClient.Version.assign(obj["version"].GetString());
        }

        if (obj.HasMember("isReference") && obj["isReference"].IsBool()) {
            labsSimClient.IsReference = obj["isReference"].GetBool();
        }
    }